

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O2

void __thiscall hdc::Class::addVariable(Class *this,ClassVariable *variable)

{
  int value;
  ClassVariable *local_18;
  
  value = this->classVariableCounter;
  this->classVariableCounter = value + 1;
  local_18 = variable;
  Variable::setLocalName(&variable->super_Variable,value);
  std::vector<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>::push_back
            (&this->variables,&local_18);
  return;
}

Assistant:

void Class::addVariable(ClassVariable* variable) {
    variable->setLocalName(classVariableCounter++);
    variables.push_back(variable);
}